

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O1

void Mpm_ManPrintStats(Mpm_Man_t *p)

{
  uint uVar1;
  Mmr_Step_t *pMVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  timespec ts;
  timespec local_28;
  
  dVar8 = (double)p->pMig->nObjs;
  pMVar2 = p->pManCuts;
  dVar7 = dVar8 * 16.0 * 9.5367431640625e-07;
  dVar8 = dVar8 * 48.0 * 9.5367431640625e-07;
  uVar1 = pMVar2->uMask;
  dVar10 = 0.0;
  dVar9 = 0.0;
  if (0 < (int)uVar1) {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (*(int *)((long)&pMVar2[3].nEntriesMax + lVar4) + 1) *
                      *(int *)((long)&pMVar2[4].nEntriesMax + lVar4);
      lVar4 = lVar4 + 0x38;
    } while ((ulong)uVar1 * 0x38 - lVar4 != 0);
    dVar9 = (double)iVar5 * 7.62939453125e-06;
  }
  if (0 < (int)uVar1) {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (*(int *)((long)&pMVar2[3].nEntriesMax + lVar4) + 1) *
                      *(int *)((long)&pMVar2[4].nEntriesMax + lVar4);
      lVar4 = lVar4 + 0x38;
    } while ((ulong)uVar1 * 0x38 - lVar4 != 0);
    dVar10 = (double)iVar5 * 7.62939453125e-06;
  }
  printf("Memory usage:  Mig = %.2f MB  Map = %.2f MB  Cut = %.2f MB    Total = %.2f MB.  ",dVar7,
         dVar8,dVar9,dVar7 + dVar8 + dVar10);
  if (p->timeDerive == 0) {
    iVar6 = 3;
    iVar5 = clock_gettime(3,&local_28);
    if (iVar5 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    lVar3 = p->timeTotal;
    Abc_Print(iVar6,"%s =","Time");
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar4 - lVar3) / 1000000.0);
  }
  else {
    putchar(10);
    iVar6 = 3;
    iVar5 = clock_gettime(3,&local_28);
    if (iVar5 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    lVar4 = lVar4 - p->timeTotal;
    p->timeTotal = lVar4;
    p->timeOther = lVar4 - p->timeDerive;
    Abc_Print(iVar6,"Runtime breakdown:\n");
    Abc_Print(iVar6,"%s =","Complete cut computation   ");
    dVar7 = 0.0;
    if (p->timeTotal != 0) {
      dVar7 = ((double)p->timeDerive * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->timeDerive / 1000000.0,dVar7);
    Abc_Print(iVar6,"%s =","- Merging cuts             ");
    dVar7 = 0.0;
    if (p->timeTotal != 0) {
      dVar7 = ((double)p->timeMerge * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->timeMerge / 1000000.0,dVar7);
    Abc_Print(iVar6,"%s =","- Evaluting cut parameters ");
    dVar7 = 0.0;
    if (p->timeTotal != 0) {
      dVar7 = ((double)p->timeEval * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->timeEval / 1000000.0,dVar7);
    Abc_Print(iVar6,"%s =","- Checking cut containment ");
    dVar7 = 0.0;
    if (p->timeTotal != 0) {
      dVar7 = ((double)p->timeCompare * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->timeCompare / 1000000.0,dVar7);
    Abc_Print(iVar6,"%s =","- Adding cuts to storage   ");
    dVar7 = 0.0;
    if (p->timeTotal != 0) {
      dVar7 = ((double)p->timeStore * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->timeStore / 1000000.0,dVar7);
    Abc_Print(iVar6,"%s =","Other                      ");
    dVar7 = 0.0;
    if (p->timeTotal != 0) {
      dVar7 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar7);
    Abc_Print(iVar6,"%s =","TOTAL                      ");
    dVar7 = (double)p->timeTotal;
    dVar8 = 0.0;
    if (p->timeTotal != 0) {
      dVar8 = (dVar7 * 100.0) / dVar7;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",dVar7 / 1000000.0,dVar8);
  }
  return;
}

Assistant:

void Mpm_ManPrintStats( Mpm_Man_t * p )
{
    printf( "Memory usage:  Mig = %.2f MB  Map = %.2f MB  Cut = %.2f MB    Total = %.2f MB.  ", 
        1.0 * Mig_ManObjNum(p->pMig) * sizeof(Mig_Obj_t) / (1 << 20), 
        1.0 * Mig_ManObjNum(p->pMig) * 48 / (1 << 20), 
        1.0 * Mmr_StepMemory(p->pManCuts) / (1 << 17), 
        1.0 * Mig_ManObjNum(p->pMig) * sizeof(Mig_Obj_t) / (1 << 20) + 
        1.0 * Mig_ManObjNum(p->pMig) * 48 / (1 << 20) +
        1.0 * Mmr_StepMemory(p->pManCuts) / (1 << 17) );
    if ( p->timeDerive )
    {
        printf( "\n" );
        p->timeTotal = Abc_Clock() - p->timeTotal;
        p->timeOther = p->timeTotal - p->timeDerive;

        Abc_Print( 1, "Runtime breakdown:\n" );
        ABC_PRTP( "Complete cut computation   ", p->timeDerive , p->timeTotal );
        ABC_PRTP( "- Merging cuts             ", p->timeMerge  , p->timeTotal );
        ABC_PRTP( "- Evaluting cut parameters ", p->timeEval   , p->timeTotal );
        ABC_PRTP( "- Checking cut containment ", p->timeCompare, p->timeTotal );
        ABC_PRTP( "- Adding cuts to storage   ", p->timeStore  , p->timeTotal );
        ABC_PRTP( "Other                      ", p->timeOther  , p->timeTotal );
        ABC_PRTP( "TOTAL                      ", p->timeTotal  , p->timeTotal );
    }
    else
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->timeTotal );
}